

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

UniquePtr<SSL_ECH_KEYS> __thiscall
bssl::anon_unknown_0::MakeTestECHKeys(anon_unknown_0 *this,uint8_t config_id)

{
  int iVar1;
  EVP_HPKE_KEM *kem;
  UniquePtr<SSL_ECH_KEYS> keys;
  UniquePtr<uint8_t> free_ech_config;
  uint8_t *ech_config;
  size_t ech_config_len;
  ScopedEVP_HPKE_KEY key;
  _Head_base<0UL,_ssl_ech_keys_st_*,_false> local_a0;
  _Head_base<0UL,_unsigned_char_*,_false> local_98;
  uint8_t *local_90;
  size_t local_88;
  EVP_HPKE_KEY local_80;
  
  EVP_HPKE_KEY_zero(&local_80);
  kem = EVP_hpke_x25519_hkdf_sha256();
  iVar1 = EVP_HPKE_KEY_generate(&local_80,kem);
  if (iVar1 != 0) {
    iVar1 = SSL_marshal_ech_config(&local_90,&local_88,config_id,&local_80,"public.example",0x10);
    if (iVar1 != 0) {
      local_98._M_head_impl = local_90;
      local_a0._M_head_impl = SSL_ECH_KEYS_new();
      if (local_a0._M_head_impl == (SSL_ECH_KEYS *)0x0) {
LAB_0016932e:
        *(undefined8 *)this = 0;
      }
      else {
        iVar1 = SSL_ECH_KEYS_add(local_a0._M_head_impl,1,local_90,local_88,&local_80);
        if (iVar1 == 0) goto LAB_0016932e;
        *(ssl_ech_keys_st **)this = local_a0._M_head_impl;
        local_a0._M_head_impl = (SSL_ECH_KEYS *)0x0;
      }
      std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&local_a0);
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_98);
      goto LAB_00169349;
    }
  }
  *(undefined8 *)this = 0;
LAB_00169349:
  EVP_HPKE_KEY_cleanup(&local_80);
  return (__uniq_ptr_data<ssl_ech_keys_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_ech_keys_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static bssl::UniquePtr<SSL_ECH_KEYS> MakeTestECHKeys(uint8_t config_id = 1) {
  bssl::ScopedEVP_HPKE_KEY key;
  uint8_t *ech_config;
  size_t ech_config_len;
  if (!EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()) ||
      !SSL_marshal_ech_config(&ech_config, &ech_config_len, config_id,
                              key.get(), "public.example", 16)) {
    return nullptr;
  }
  bssl::UniquePtr<uint8_t> free_ech_config(ech_config);

  // Install a non-retry config.
  bssl::UniquePtr<SSL_ECH_KEYS> keys(SSL_ECH_KEYS_new());
  if (!keys || !SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1, ech_config,
                                 ech_config_len, key.get())) {
    return nullptr;
  }
  return keys;
}